

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::InitialValueCase::iterate(InitialValueCase *this)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  GLenum err;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  CallLogWrapper gl;
  StateQueryMemoryWriteGuard<float[8]> state;
  CallLogWrapper local_220;
  StateQueryMemoryWriteGuard<float[8]> local_208;
  Array<float_*> local_1a8;
  undefined1 local_198 [384];
  
  local_208.m_postguard[4] = -8.0297587e+18;
  local_208.m_postguard[5] = -8.0297587e+18;
  local_208.m_postguard[6] = -8.0297587e+18;
  local_208.m_postguard[7] = -8.0297587e+18;
  local_208.m_postguard[0] = -8.0297587e+18;
  local_208.m_postguard[1] = -8.0297587e+18;
  local_208.m_postguard[2] = -8.0297587e+18;
  local_208.m_postguard[3] = -8.0297587e+18;
  local_208.m_value[4] = -8.0297587e+18;
  local_208.m_value[5] = -8.0297587e+18;
  local_208.m_value[6] = -8.0297587e+18;
  local_208.m_value[7] = -8.0297587e+18;
  local_208.m_value[0] = -8.0297587e+18;
  local_208.m_value[1] = -8.0297587e+18;
  local_208.m_value[2] = -8.0297587e+18;
  local_208.m_value[3] = -8.0297587e+18;
  local_208.m_preguard[4] = -8.0297587e+18;
  local_208.m_preguard[5] = -8.0297587e+18;
  local_208.m_preguard[6] = -8.0297587e+18;
  local_208.m_preguard[7] = -8.0297587e+18;
  local_208.m_preguard[0] = -8.0297587e+18;
  local_208.m_preguard[1] = -8.0297587e+18;
  local_208.m_preguard[2] = -8.0297587e+18;
  local_208.m_preguard[3] = -8.0297587e+18;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_220,(Functions *)CONCAT44(extraout_var,iVar3),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  local_220.m_enableLog = true;
  local_198._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Querying GL_PRIMITIVE_BOUNDING_BOX_EXT, expecting (-1, -1, -1, 1) (1, 1, 1, 1)",0x4e);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x78));
  glu::CallLogWrapper::glGetFloatv(&local_220,0x92be,local_208.m_value);
  err = glu::CallLogWrapper::glGetError(&local_220);
  glu::checkError(err,"query",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                  ,0xbe);
  bVar2 = gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[8]>::verifyValidity
                    (&local_208,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if (bVar2) {
    local_198._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Got ",4);
    local_1a8.end = local_208.m_postguard;
    local_1a8.begin = local_208.m_value;
    tcu::Format::operator<<((ostream *)poVar1,&local_1a8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x78));
    if (((((local_208.m_value[0] != -1.0) || (NAN(local_208.m_value[0]))) ||
         (local_208.m_value[1] != -1.0)) ||
        (((NAN(local_208.m_value[1]) || (local_208.m_value[2] != -1.0)) ||
         ((NAN(local_208.m_value[2]) ||
          ((local_208.m_value[3] != 1.0 || (NAN(local_208.m_value[3]))))))))) ||
       ((local_208.m_value[4] != 1.0 ||
        (((((NAN(local_208.m_value[4]) || (local_208.m_value[5] != 1.0)) ||
           (NAN(local_208.m_value[5]))) ||
          ((local_208.m_value[6] != 1.0 || (NAN(local_208.m_value[6]))))) ||
         ((local_208.m_value[7] != 1.0 || (NAN(local_208.m_value[7]))))))))) {
      local_198._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_198 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Error, unexpected value",0x17);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x78));
      description = "Invalid initial value";
      testResult = QP_TEST_RESULT_FAIL;
    }
    else {
      testResult = QP_TEST_RESULT_PASS;
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,description
              );
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_220);
  return STOP;
}

Assistant:

InitialValueCase::IterateResult InitialValueCase::iterate (void)
{
	StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLfloat[8]>	state;
	glu::CallLogWrapper											gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

	gl.enableLogging(true);

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Querying GL_PRIMITIVE_BOUNDING_BOX_EXT, expecting (-1, -1, -1, 1) (1, 1, 1, 1)"
		<< tcu::TestLog::EndMessage;

	gl.glGetFloatv(GL_PRIMITIVE_BOUNDING_BOX_EXT, state);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "query");

	if (!state.verifyValidity(m_testCtx))
		return STOP;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Got " << tcu::formatArray(&state[0], &state[8])
		<< tcu::TestLog::EndMessage;

	if ((state[0] != -1.0f) || (state[1] != -1.0f) || (state[2] != -1.0f) || (state[3] != 1.0f) ||
		(state[4] !=  1.0f) || (state[5] !=  1.0f) || (state[6] !=  1.0f) || (state[7] != 1.0f))
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Error, unexpected value"
			<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid initial value");
	}
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}